

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::UniformLocMultipleUniforms::Run(UniformLocMultipleUniforms *this)

{
  UniformValueGenerator *generator;
  long lVar1;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  local_3b8;
  UniformType local_3a0;
  UniformType local_310;
  UniformType local_280;
  Uniform local_1f0;
  
  local_3b8.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniformType::UniformType(&local_280,0x8b52,0);
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  Uniform::Uniform(&local_1f0,generator,&local_280,(Loc)ZEXT812(2),(DefOccurence)0x0,
                   (DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&local_3b8,&local_1f0);
  Uniform::~Uniform(&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.refStrType._M_dataplus._M_p != &local_280.refStrType.field_2) {
    operator_delete(local_280.refStrType._M_dataplus._M_p,
                    local_280.refStrType.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.strType._M_dataplus._M_p != &local_280.strType.field_2) {
    operator_delete(local_280.strType._M_dataplus._M_p,
                    local_280.strType.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector(&local_280.childTypes);
  if (local_280.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.arraySizesSegmented.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.arraySizesSegmented.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  UniformType::UniformType(&local_310,0x8b52,0);
  Uniform::Uniform(&local_1f0,generator,&local_310,(Loc)ZEXT812(3),(DefOccurence)0x0,
                   (DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&local_3b8,&local_1f0);
  Uniform::~Uniform(&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.refStrType._M_dataplus._M_p != &local_310.refStrType.field_2) {
    operator_delete(local_310.refStrType._M_dataplus._M_p,
                    local_310.refStrType.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.strType._M_dataplus._M_p != &local_310.strType.field_2) {
    operator_delete(local_310.strType._M_dataplus._M_p,
                    local_310.strType.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector(&local_310.childTypes);
  if (local_310.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_310.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_310.arraySizesSegmented.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_310.arraySizesSegmented.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  UniformType::UniformType(&local_3a0,0x8b52,0);
  Uniform::Uniform(&local_1f0,generator,&local_3a0,(Loc)ZEXT812(5),(DefOccurence)0x0,
                   (DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&local_3b8,&local_1f0);
  Uniform::~Uniform(&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0.refStrType._M_dataplus._M_p != &local_3a0.refStrType.field_2) {
    operator_delete(local_3a0.refStrType._M_dataplus._M_p,
                    local_3a0.refStrType.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0.strType._M_dataplus._M_p != &local_3a0.strType.field_2) {
    operator_delete(local_3a0.strType._M_dataplus._M_p,
                    local_3a0.strType.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector(&local_3a0.childTypes);
  if (local_3a0.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a0.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3a0.arraySizesSegmented.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a0.arraySizesSegmented.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,&local_3b8);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector(&local_3b8);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//layout (location = 2) uniform vec4 u0;
		//layout (location = 3) uniform vec4 u1;
		//layout (location = 5) uniform vec4 u2;
		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_VEC4, Loc::C(2)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_VEC4, Loc::C(3)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_VEC4, Loc::C(5)));
		return doRun(uniforms);
	}